

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O0

string * __thiscall
vkt::(anonymous_namespace)::getEndiannessName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int endianness)

{
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  int endianness_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DE_BIG_ENDIAN",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DE_LITTLE_ENDIAN",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else {
    de::toString<int>(__return_storage_ptr__,&local_14);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getEndiannessName (int endianness)
{
	switch (endianness)
	{
		case DE_BIG_ENDIAN:		return "DE_BIG_ENDIAN";
		case DE_LITTLE_ENDIAN:	return "DE_LITTLE_ENDIAN";
		default:
			return de::toString(endianness);
	}
}